

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O1

void divsufsortxx::helper::
     fixdown<divsufsortxx::substring::substring_wrapper<char*,bitmap::BitmapArray<long>::iterator>,bitmap::BitmapArray<long>::iterator,long>
               (substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> Td,iterator SA,long i
               ,long size)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  long lVar7;
  pos_type pVar8;
  long lVar9;
  BitmapArray<long> *pBVar10;
  long lVar11;
  
  pVar8 = SA.pos_;
  pBVar10 = SA.array_;
  iVar5 = (*(pBVar10->super_Bitmap)._vptr_Bitmap[5])(pBVar10,pVar8 + i);
  iVar6 = (*((Td.m_PA.array_)->super_Bitmap)._vptr_Bitmap[5])
                    (Td.m_PA.array_,CONCAT44(extraout_var,iVar5) + Td.m_PA.pos_);
  lVar7 = i * 2 + 1;
  if (lVar7 < size) {
    cVar1 = Td.m_Td[CONCAT44(extraout_var_00,iVar6)];
    lVar9 = i * 2;
    lVar11 = i;
    do {
      iVar6 = (*(pBVar10->super_Bitmap)._vptr_Bitmap[5])(pBVar10,lVar7 + pVar8);
      iVar6 = (*((Td.m_PA.array_)->super_Bitmap)._vptr_Bitmap[5])
                        (Td.m_PA.array_,CONCAT44(extraout_var_01,iVar6) + Td.m_PA.pos_);
      cVar2 = Td.m_Td[CONCAT44(extraout_var_02,iVar6)];
      iVar6 = (*(pBVar10->super_Bitmap)._vptr_Bitmap[5])(pBVar10,lVar9 + pVar8 + 2);
      iVar6 = (*((Td.m_PA.array_)->super_Bitmap)._vptr_Bitmap[5])
                        (Td.m_PA.array_,CONCAT44(extraout_var_03,iVar6) + Td.m_PA.pos_);
      cVar3 = Td.m_Td[CONCAT44(extraout_var_04,iVar6)];
      cVar4 = cVar2;
      if (cVar2 <= cVar3) {
        cVar4 = cVar3;
      }
      i = lVar11;
      if (cVar4 <= cVar1) break;
      i = lVar7;
      if (cVar2 < cVar3) {
        i = lVar9 + 2;
      }
      iVar6 = (*(pBVar10->super_Bitmap)._vptr_Bitmap[5])(pBVar10,pVar8 + i);
      (*(pBVar10->super_Bitmap)._vptr_Bitmap[4])
                (pBVar10,lVar11 + pVar8,CONCAT44(extraout_var_05,iVar6));
      lVar9 = i * 2;
      lVar7 = i * 2 + 1;
      lVar11 = i;
    } while (lVar7 < size);
  }
  (*(pBVar10->super_Bitmap)._vptr_Bitmap[4])(pBVar10,i + pVar8,CONCAT44(extraout_var,iVar5));
  return;
}

Assistant:

void fixdown(const StringIterator_type Td, SAIterator_type SA, pos_type i,
             pos_type size) {
  typedef typename std::iterator_traits<StringIterator_type>::value_type value_type;
  pos_type j, k, t;
  value_type c, d, e;

  for (t = SA[i], c = Td[t]; (j = 2 * i + 1) < size; SA[i] = SA[k], i = k) {
    d = Td[SA[k = j++]];
    if (d < (e = Td[SA[j]])) {
      k = j;
      d = e;
    }
    if (d <= c) {
      break;
    }
  }
  SA[i] = t;
}